

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void us_socket_context_on_writable
               (int ssl,us_socket_context_t *context,
               _func_us_socket_t_ptr_us_socket_t_ptr *on_writable)

{
  if (ssl != 0) {
    us_internal_ssl_socket_context_on_writable
              ((us_internal_ssl_socket_context_t *)context,
               (_func_us_internal_ssl_socket_t_ptr_us_internal_ssl_socket_t_ptr *)on_writable);
    return;
  }
  context->on_writable = on_writable;
  return;
}

Assistant:

void us_socket_context_on_writable(int ssl, struct us_socket_context_t *context, struct us_socket_t *(*on_writable)(struct us_socket_t *s)) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        us_internal_ssl_socket_context_on_writable((struct us_internal_ssl_socket_context_t *) context, (struct us_internal_ssl_socket_t * (*)(struct us_internal_ssl_socket_t *)) on_writable);
        return;
    }
#endif

    context->on_writable = on_writable;
}